

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O3

void __thiscall
FIX::double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  long lVar1;
  Vector<char> buffer_00;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  Bignum *denominator_00;
  uint uVar11;
  uint *puVar12;
  int iVar13;
  Bignum *b;
  double factor;
  uint64_t d64;
  uint uVar14;
  byte bVar15;
  double dVar16;
  float fVar17;
  Bignum denominator;
  Bignum numerator;
  Bignum delta_plus;
  Bignum delta_minus;
  undefined2 in_stack_fffffffffffff740;
  byte bVar18;
  Bignum local_890;
  Bignum local_678;
  Bignum local_460;
  Bignum local_248;
  
  denominator_00 = (Bignum *)CONCAT44(in_register_00000014,requested_digits);
  puVar12 = buffer._8_8_;
  uVar8 = (uint)buffer.start_;
  if (v <= 0.0) {
    __assert_fail("v > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,0x5b,
                  "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  if (((ulong)v & 0x7ff0000000000000) == 0x7ff0000000000000) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,0x5c,
                  "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  uVar11 = (uint)this;
  if (uVar11 == 1) {
    fVar17 = (float)v;
    if (((double)fVar17 != v) || (NAN((double)fVar17) || NAN(v))) {
      __assert_fail("f == v",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                    ,0x62,
                    "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                   );
    }
    uVar10 = (uint)fVar17 & 0x7fffff;
    uVar14 = uVar10 | 0x800000;
    if ((uint)fVar17 < 0x800000) {
      uVar14 = uVar10;
    }
    factor = (double)(ulong)uVar14;
    iVar4 = -0x95;
    if ((uint)fVar17 >= 0x800000) {
      iVar4 = ((uint)fVar17 >> 0x17) - 0x96;
    }
    bVar7 = 0xffffff < (uint)fVar17 && uVar10 == 0;
LAB_001699b5:
    bVar15 = uVar11 < 2;
    v = factor;
    if (factor == 0.0) {
      __assert_fail("significand != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                    ,0x26,"int FIX::double_conversion::NormalizedExponent(uint64_t, int)");
    }
  }
  else {
    factor = (double)((ulong)v & 0xfffffffffffff);
    bVar7 = (ulong)v >> 0x35 != 0 && factor == 0.0;
    if (((ulong)v & 0x7ff0000000000000) == 0) {
      iVar4 = -0x432;
      goto LAB_001699b5;
    }
    iVar4 = (uint)((ulong)v >> 0x34) - 0x433;
    factor = (double)((long)factor + 0x10000000000000);
    bVar15 = uVar11 == 0;
  }
  lVar1 = 0x3f;
  if (((ulong)factor & 0xfffffffffffff) != 0) {
    for (; ((ulong)factor & 0xfffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar13 = (iVar4 + 0xb) - ((uint)lVar1 ^ 0x3f);
  if (((ulong)factor & 0x10000000000000) != 0) {
    iVar13 = iVar4;
  }
  dVar16 = ceil((double)(iVar13 + 0x34) * 0.30102999566398114 + -1e-10);
  uVar14 = (uint)dVar16;
  if ((uVar11 == 2) && ((int)mode < (int)~uVar14)) {
    if (0 < (int)uVar8) {
      *(undefined1 *)denominator_00->bigits_buffer_ = 0;
      *puVar12 = 0;
      *length = -mode;
      return;
    }
    goto LAB_0016a0ad;
  }
  Bignum::Bignum(&local_678);
  Bignum::Bignum(&local_890);
  Bignum::Bignum(&local_248);
  Bignum::Bignum(&local_460);
  if (iVar4 < 0) {
    if ((int)uVar14 < 0) {
      Bignum::AssignPowerUInt16(&local_678,10,-uVar14);
      if (bVar15 == 0) {
        Bignum::MultiplyByUInt64(&local_678,(uint64_t)factor);
        Bignum::AssignUInt16(&local_890,1);
        iVar13 = -iVar4;
      }
      else {
        Bignum::AssignBignum(&local_460,&local_678);
        Bignum::AssignBignum(&local_248,&local_678);
        Bignum::MultiplyByUInt64(&local_678,(uint64_t)factor);
        iVar13 = 1;
        Bignum::AssignUInt16(&local_890,1);
        Bignum::ShiftLeft(&local_890,-iVar4);
        Bignum::ShiftLeft(&local_678,1);
      }
      bVar18 = bVar7;
      Bignum::ShiftLeft(&local_890,iVar13);
    }
    else {
      Bignum::AssignUInt64(&local_678,(uint64_t)factor);
      Bignum::AssignPowerUInt16(&local_890,10,uVar14);
      Bignum::ShiftLeft(&local_890,-iVar4);
      if (bVar15 == 0) goto LAB_00169ccf;
      Bignum::ShiftLeft(&local_890,1);
      Bignum::ShiftLeft(&local_678,1);
      Bignum::AssignUInt16(&local_460,1);
      Bignum::AssignUInt16(&local_248,1);
      bVar18 = bVar7;
    }
LAB_00169c92:
    bVar2 = bVar15 & bVar7;
    bVar7 = bVar18;
    if (bVar2 == 1) {
      Bignum::ShiftLeft(&local_890,1);
      Bignum::ShiftLeft(&local_678,1);
      Bignum::ShiftLeft(&local_460,1);
      bVar7 = bVar18;
    }
  }
  else {
    if ((int)uVar14 < 0) {
      __assert_fail("estimated_power >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                    ,0x1a7,
                    "void FIX::double_conversion::InitialScaledStartValuesPositiveExponent(uint64_t, int, int, bool, Bignum *, Bignum *, Bignum *, Bignum *)"
                   );
    }
    Bignum::AssignUInt64(&local_678,(uint64_t)factor);
    Bignum::ShiftLeft(&local_678,iVar4);
    Bignum::AssignPowerUInt16(&local_890,10,uVar14);
    if (bVar15 != 0) {
      Bignum::ShiftLeft(&local_890,1);
      Bignum::ShiftLeft(&local_678,1);
      Bignum::AssignUInt16(&local_460,1);
      Bignum::ShiftLeft(&local_460,iVar4);
      Bignum::AssignUInt16(&local_248,1);
      Bignum::ShiftLeft(&local_248,iVar4);
      bVar18 = bVar7;
      goto LAB_00169c92;
    }
  }
LAB_00169ccf:
  iVar4 = Bignum::PlusCompare(&local_678,&local_460,&local_890);
  if (((ulong)v & 1) == 0) {
    if (iVar4 < 0) goto LAB_00169d02;
LAB_00169d64:
    *length = uVar14 + 1;
  }
  else {
    if (0 < iVar4) goto LAB_00169d64;
LAB_00169d02:
    *length = uVar14;
    Bignum::MultiplyByUInt32(&local_678,10);
    iVar4 = Bignum::Compare(&local_248,&local_460);
    Bignum::MultiplyByUInt32(&local_248,10);
    if (iVar4 == 0) {
      Bignum::AssignBignum(&local_460,&local_248);
    }
    else {
      Bignum::MultiplyByUInt32(&local_460,10);
    }
  }
  if (uVar11 < 2) {
    iVar4 = Bignum::Compare(&local_248,&local_460);
    b = &local_460;
    if (iVar4 == 0) {
      b = &local_248;
    }
    *puVar12 = 0;
    uVar3 = Bignum::DivideModuloIntBignum(&local_678,&local_890);
    if (uVar3 < 10) {
      uVar14 = SUB84(v,0) & 1 ^ 1;
      uVar11 = (uint)(((ulong)v & 1) == 0);
      iVar13 = -uVar11;
      do {
        uVar10 = *puVar12;
        *puVar12 = uVar10 + 1;
        if (((long)(int)uVar10 < 0) || ((int)uVar8 <= (int)uVar10)) goto LAB_0016a0ad;
        *(byte *)((long)denominator_00->bigits_buffer_ + (long)(int)uVar10) = (byte)uVar3 | 0x30;
        iVar5 = Bignum::Compare(&local_678,&local_248);
        iVar6 = Bignum::PlusCompare(&local_678,b,&local_890);
        if ((iVar5 < (int)uVar14) ||
           (iVar6 != iVar13 && SBORROW4(iVar6,iVar13) == (int)(iVar6 + uVar11) < 0)) {
          if ((iVar5 < (int)uVar14) &&
             (iVar6 != iVar13 && SBORROW4(iVar6,iVar13) == (int)(iVar6 + uVar11) < 0)) {
            iVar4 = Bignum::PlusCompare(&local_678,&local_678,&local_890);
            if (iVar4 < 0) goto LAB_00169fce;
            uVar11 = *puVar12;
            uVar9 = (ulong)uVar11;
            if (iVar4 == 0) {
              if ((int)uVar8 < (int)uVar11 || (int)uVar11 < 1) goto LAB_0016a0ad;
              bVar7 = *(byte *)((long)denominator_00->bigits_buffer_ + (uVar9 - 1));
              if ((bVar7 & 1) == 0) goto LAB_00169fce;
              if (bVar7 == 0x39) {
                __assert_fail("buffer[(*length) - 1] != \'9\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                              ,0xff,
                              "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                             );
              }
            }
            else {
              if ((int)uVar8 < (int)uVar11 || (int)uVar11 < 1) goto LAB_0016a0ad;
              bVar7 = *(byte *)((long)denominator_00->bigits_buffer_ + (uVar9 - 1));
              if (bVar7 == 0x39) {
                __assert_fail("buffer[(*length) - 1] != \'9\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                              ,0xf4,
                              "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                             );
              }
            }
          }
          else {
            if (iVar5 < (int)uVar14) goto LAB_00169fce;
            uVar9 = (ulong)(int)*puVar12;
            if (((long)uVar9 < 1) || ((int)uVar8 < (int)*puVar12)) goto LAB_0016a0ad;
            bVar7 = *(byte *)((long)denominator_00->bigits_buffer_ + (uVar9 - 1));
            if (bVar7 == 0x39) {
              __assert_fail("buffer[(*length) -1] != \'9\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                            ,0x10d,
                            "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                           );
            }
          }
          *(byte *)((long)denominator_00->bigits_buffer_ + (uVar9 - 1)) = bVar7 + 1;
          goto LAB_00169fce;
        }
        Bignum::MultiplyByUInt32(&local_678,10);
        Bignum::MultiplyByUInt32(&local_248,10);
        if (iVar4 != 0) {
          Bignum::MultiplyByUInt32(&local_460,10);
        }
        uVar3 = Bignum::DivideModuloIntBignum(&local_678,&local_890);
      } while (uVar3 < 10);
    }
    __assert_fail("digit <= 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,0xc6,
                  "void FIX::double_conversion::GenerateShortestDigits(Bignum *, Bignum *, Bignum *, Bignum *, bool, Vector<char>, int *)"
                 );
  }
  if (uVar11 == 2) {
    iVar4 = *length;
    if ((int)mode < -iVar4) {
      *length = -mode;
      *puVar12 = 0;
    }
    else {
      if (-iVar4 != mode) {
        mode = iVar4 + mode;
        goto LAB_00169dbe;
      }
      if (iVar4 + mode != 0) {
        __assert_fail("*decimal_point == -requested_digits",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                      ,0x158,
                      "void FIX::double_conversion::BignumToFixed(int, int *, Bignum *, Bignum *, Vector<char>, int *)"
                     );
      }
      Bignum::MultiplyByUInt32(&local_890,10);
      iVar4 = Bignum::PlusCompare(&local_678,&local_678,&local_890);
      if (iVar4 < 0) {
        *puVar12 = 0;
      }
      else {
        if ((int)uVar8 < 1) goto LAB_0016a0ad;
        *(undefined1 *)denominator_00->bigits_buffer_ = 0x31;
        *puVar12 = 1;
        *length = *length + 1;
      }
    }
  }
  else {
    if (uVar11 != 3) {
      abort();
    }
LAB_00169dbe:
    buffer_00.length_._0_2_ = in_stack_fffffffffffff740;
    buffer_00.start_ = (char *)puVar12;
    buffer_00.length_._2_1_ = bVar7;
    buffer_00.length_._3_1_ = bVar15;
    buffer_00._12_4_ = uVar8;
    GenerateCountedDigits
              ((double_conversion *)(ulong)mode,(int)length,(int *)&local_678,&local_890,
               denominator_00,buffer_00,(int *)(ulong)uVar8);
  }
LAB_00169fce:
  uVar11 = *puVar12;
  if ((-1 < (long)(int)uVar11) && ((int)uVar11 < (int)uVar8)) {
    *(undefined1 *)((long)denominator_00->bigits_buffer_ + (long)(int)uVar11) = 0;
    return;
  }
LAB_0016a0ad:
  __assert_fail("0 <= index && index < length_",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xcc,"T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      UNREACHABLE();
  }
  buffer[*length] = '\0';
}